

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziparchive.cpp
# Opt level: O0

void __thiscall ZipArchive::ZipArchive(ZipArchive *this,string *fileName,int numFiles,int strLen)

{
  pointer puVar1;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> local_38 [3];
  int local_20;
  int local_1c;
  int strLen_local;
  int numFiles_local;
  string *fileName_local;
  ZipArchive *this_local;
  
  this->zipAlign = false;
  this->force64 = false;
  local_20 = strLen;
  local_1c = numFiles;
  _strLen_local = fileName;
  fileName_local = (string *)this;
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<std::default_delete<unsigned_char[]>,void>
            ((unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>> *)&this->entries);
  File::File(&this->f,_strLen_local,WRITE);
  this->lastHeader = 0;
  std::make_unique<unsigned_char[]>((size_t)local_38);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator=
            (&this->entries,local_38);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(local_38);
  puVar1 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                     (&this->entries);
  this->entryPtr = puVar1;
  this->entryCount = 0;
  return;
}

Assistant:

ZipArchive::ZipArchive(const std::string& fileName, int numFiles, int strLen)
    : f{fileName, File::WRITE}
{
    static_assert(sizeof(LocalEntry) == 30);
    static_assert(sizeof(CentralDirEntry) == 46);

    entries = std::make_unique<uint8_t[]>(
        strLen + numFiles * (sizeof(CentralDirEntry) + sizeof(Extra64)));
    entryPtr = entries.get();
    entryCount = 0;
}